

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

CTcStreamAnchor * __thiscall
CTcDataStream::add_anchor
          (CTcDataStream *this,CTcSymbol *owner_sym,CTcAbsFixup **fixup_list_head,ulong ofs)

{
  CTcStreamAnchor *this_00;
  CTcStreamAnchor *pCVar1;
  
  this_00 = (CTcStreamAnchor *)CTcPrsMem::alloc(this->allocator_,0x30);
  CTcStreamAnchor::CTcStreamAnchor(this_00,owner_sym,fixup_list_head,ofs);
  pCVar1 = (CTcStreamAnchor *)&this->first_anchor_;
  if (this->last_anchor_ != (CTcStreamAnchor *)0x0) {
    pCVar1 = this->last_anchor_;
  }
  pCVar1->nxt_ = this_00;
  this->last_anchor_ = this_00;
  return this_00;
}

Assistant:

CTcStreamAnchor *CTcDataStream::add_anchor(CTcSymbol *owner_sym,
                                           CTcAbsFixup **fixup_list_head,
                                           ulong ofs)
{
    CTcStreamAnchor *anchor;
    
    /* allocate the anchor, giving it our current offset */
    anchor = new (allocator_) CTcStreamAnchor(owner_sym,
                                              fixup_list_head, ofs);

    /* append it to our list */
    if (last_anchor_ != 0)
        last_anchor_->nxt_ = anchor;
    else
        first_anchor_ = anchor;
    last_anchor_ = anchor;

    /* return the new anchor */
    return anchor;
}